

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildDeclaration(CNscPStackEntry *pType,CNscPStackEntry *pList)

{
  bool bVar1;
  NscType NVar2;
  NscSymbol *pNVar3;
  CNscContext *in_RSI;
  NscSymbol *pSymbol;
  CNscPStackEntry *in_stack_ffffffffffffffe8;
  
  CNscContext::FreePStackEntry(in_RSI,in_stack_ffffffffffffffe8);
  if ((((in_RSI != (CNscContext *)0x0) &&
       (NVar2 = CNscPStackEntry::GetType((CNscPStackEntry *)in_RSI), NVar2 != NscType_Error)) &&
      (bVar1 = CNscContext::IsGlobalScope(g_pCtx), bVar1)) &&
     ((bVar1 = CNscContext::IsPhase2(g_pCtx), bVar1 ||
      (bVar1 = CNscContext::IsNWScript(g_pCtx), bVar1)))) {
    if (g_nNscLastDeclSymbol == 0xffffffff) {
      __assert_fail("g_nNscLastDeclSymbol != 0xffffffff",
                    "/workspace/llm4binary/github/license_c_cmakelists/nwneetools[P]nwnsc/_NscLib/NscParserRoutines.cpp"
                    ,0x5d0,
                    "CNscPStackEntry *NscBuildDeclaration(CNscPStackEntry *, CNscPStackEntry *)");
    }
    pNVar3 = CNscContext::GetSymbol(in_RSI,(size_t)in_stack_ffffffffffffffe8);
    (pNVar3->field_6).field_2.ulFlags = (pNVar3->field_6).field_2.ulFlags | 0x8000000;
    g_nNscLastDeclSymbol = 0xffffffff;
  }
  return (CNscPStackEntry *)in_RSI;
}

Assistant:

YYSTYPE NscBuildDeclaration (YYSTYPE pType, YYSTYPE pList)
{

	//
	// Free the type
	//

    g_pCtx ->FreePStackEntry (pType);

	//
	// If we have a list, mark the last symbol as being the last
	//

    if (pList != NULL && pList ->GetType () != NscType_Error && 
		g_pCtx ->IsGlobalScope () && 
		(g_pCtx ->IsPhase2 () || g_pCtx ->IsNWScript ()))
	{
		assert (g_nNscLastDeclSymbol != 0xffffffff);
		NscSymbol *pSymbol = g_pCtx ->GetSymbol (g_nNscLastDeclSymbol);
		pSymbol ->ulFlags |= NscSymFlag_LastDecl;
		g_nNscLastDeclSymbol = 0xffffffff;
	}

	//
	// Return the list
	//

	return pList;
}